

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::Desugarer::makeObject(Desugarer *this,Object *ast,uint obj_level)

{
  value_type *pvVar1;
  bool bVar2;
  ostream *this_00;
  void *this_01;
  size_type sVar3;
  reference ppVar4;
  Self *pSVar5;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*> *pair;
  iterator __end3;
  iterator __begin3;
  SuperVars *__range3;
  Binds binds;
  AST *retval;
  ObjectField *field;
  iterator __end2;
  iterator __begin2;
  ObjectFields *__range2;
  ASTs new_asserts;
  Fields new_fields;
  SuperVars svs;
  Self *body;
  Identifier *hidden_var;
  value_type *in_stack_fffffffffffffc08;
  ObjectField *in_stack_fffffffffffffc10;
  DesugaredObject *pDVar6;
  LocationRange *in_stack_fffffffffffffc18;
  Desugarer *in_stack_fffffffffffffc20;
  Hide *in_stack_fffffffffffffc28;
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  *in_stack_fffffffffffffc30;
  allocator<char32_t> *in_stack_fffffffffffffc40;
  char32_t *in_stack_fffffffffffffc48;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffc50;
  Desugarer local_388 [11];
  Desugarer local_2d8 [3];
  AST *in_stack_fffffffffffffd58;
  Fodder *in_stack_fffffffffffffd60;
  Identifier *in_stack_fffffffffffffd68;
  Fodder *in_stack_fffffffffffffd70;
  Fodder *in_stack_fffffffffffffd78;
  Fodder *in_stack_fffffffffffffd90;
  __normal_iterator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_*,_std::vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>_>
  local_218;
  vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  *local_210;
  DesugaredObject *local_1f0;
  reference local_1e8;
  ObjectField *local_1e0;
  __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
  local_1d8;
  long local_1d0;
  vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  local_198 [9];
  uint in_stack_ffffffffffffff54;
  ObjectFields *in_stack_ffffffffffffff58;
  AST *in_stack_ffffffffffffff60;
  Desugarer *in_stack_ffffffffffffff68;
  
  if (in_EDX == 0) {
    ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2af82b);
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    id((Desugarer *)in_stack_fffffffffffffc10,(UString *)in_stack_fffffffffffffc08);
    ::std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffc10);
    ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2af879);
    pvVar1 = (value_type *)EF;
    make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
              ((Desugarer *)in_stack_fffffffffffffc10,(LocationRange *)in_stack_fffffffffffffc08,
               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                *)0x2af8a3);
    in_stack_fffffffffffffc08 = pvVar1;
    ObjectField::Local(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68
                       ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                       in_stack_fffffffffffffd90);
    ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
    push_back((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
               *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    ObjectField::~ObjectField(in_stack_fffffffffffffc10);
  }
  desugarFields(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                in_stack_ffffffffffffff54);
  ::std::
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ::vector((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
            *)0x2af9bc);
  ::std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::list
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)0x2af9c9);
  local_1d0 = in_RSI + 0x80;
  local_1d8._M_current =
       (ObjectField *)
       ::std::
       vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
       begin((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              *)in_stack_fffffffffffffc08);
  local_1e0 = (ObjectField *)
              ::std::
              vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
              ::end((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                     *)in_stack_fffffffffffffc08);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc10,
                            (__normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                             *)in_stack_fffffffffffffc08), bVar2) {
    local_1e8 = __gnu_cxx::
                __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
                ::operator*(&local_1d8);
    if (local_1e8->kind == ASSERT) {
      ::std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
      push_back((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
                in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
    }
    else if (local_1e8->kind == FIELD_EXPR) {
      ::std::
      vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
      ::
      emplace_back<jsonnet::internal::ObjectField::Hide_const&,jsonnet::internal::AST*const&,jsonnet::internal::AST*const&>
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                 (AST **)in_stack_fffffffffffffc20,(AST **)in_stack_fffffffffffffc18);
    }
    else {
      this_00 = ::std::operator<<((ostream *)&::std::cerr,
                                  "INTERNAL ERROR: field should have been desugared: ");
      this_01 = (void *)::std::ostream::operator<<(this_00,local_1e8->kind);
      ::std::ostream::operator<<(this_01,::std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ObjectField_*,_std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>_>
    ::operator++(&local_1d8);
  }
  local_1f0 = make<jsonnet::internal::DesugaredObject,jsonnet::internal::LocationRange&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>&>
                        (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                         (list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                          *)in_stack_fffffffffffffc10,
                         (vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                          *)in_stack_fffffffffffffc08);
  sVar3 = ::std::
          vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
          ::size(local_198);
  if (sVar3 != 0) {
    ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
            *)0x2afb7e);
    local_210 = local_198;
    local_218._M_current =
         (pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*> *)
         ::std::
         vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
         ::begin((vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                  *)in_stack_fffffffffffffc08);
    ::std::
    vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
    ::end((vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
           *)in_stack_fffffffffffffc08);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_*,_std::vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>_>
                               *)in_stack_fffffffffffffc10,
                              (__normal_iterator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_*,_std::vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>_>
                               *)in_stack_fffffffffffffc08), bVar2) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_*,_std::vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>_>
               ::operator*(&local_218);
      if (ppVar4->second == (AST *)0x0) {
        in_stack_fffffffffffffc20 = (Desugarer *)ppVar4->first;
        pSVar5 = make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                           ((Desugarer *)in_stack_fffffffffffffc10,
                            (LocationRange *)in_stack_fffffffffffffc08,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)0x2afc26);
        bind(local_2d8,in_EDI,(sockaddr *)in_stack_fffffffffffffc20,(socklen_t)pSVar5);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        push_back((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                   *)in_stack_fffffffffffffc10,(value_type *)in_stack_fffffffffffffc08);
        Local::Bind::~Bind((Bind *)in_stack_fffffffffffffc10);
      }
      else {
        bind(local_388,in_EDI,(sockaddr *)ppVar4->first,(socklen_t)ppVar4->second);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        push_back((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                   *)in_stack_fffffffffffffc10,(value_type *)in_stack_fffffffffffffc08);
        Local::Bind::~Bind((Bind *)in_stack_fffffffffffffc10);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_*,_std::vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>_>
      ::operator++(&local_218);
    }
    local_1f0 = (DesugaredObject *)
                make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                          (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)in_stack_fffffffffffffc10,
                           (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                            *)in_stack_fffffffffffffc08,(AST **)0x2afd54);
    ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
             *)in_stack_fffffffffffffc20);
  }
  pDVar6 = local_1f0;
  ::std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::~list
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)0x2afda0);
  ::std::
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ::~vector((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
             *)in_stack_fffffffffffffc20);
  ::std::
  vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  ::~vector((vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
             *)in_stack_fffffffffffffc20);
  return &pDVar6->super_AST;
}

Assistant:

AST* makeObject(Object *ast, unsigned obj_level) {
        // Hidden variable to allow outer/top binding.
        if (obj_level == 0) {
            const Identifier *hidden_var = id(U"$");
            auto *body = make<Self>(E, EF);
            ast->fields.push_back(ObjectField::Local(EF, EF, hidden_var, EF, body, EF));
        }

        SuperVars svs = desugarFields(ast, ast->fields, obj_level);

        DesugaredObject::Fields new_fields;
        ASTs new_asserts;
        for (const ObjectField &field : ast->fields) {
            if (field.kind == ObjectField::ASSERT) {
                new_asserts.push_back(field.expr2);
            } else if (field.kind == ObjectField::FIELD_EXPR) {
                new_fields.emplace_back(field.hide, field.expr1, field.expr2);
            } else {
                std::cerr << "INTERNAL ERROR: field should have been desugared: " << field.kind
                          << std::endl;
            }
        }

        AST* retval = make<DesugaredObject>(ast->location, new_asserts, new_fields);
        if (svs.size() > 0) {
            Local::Binds binds;
            for (const auto &pair : svs) {
                if (pair.second == nullptr) {
                    // Self binding
                    binds.push_back(bind(pair.first, make<Self>(E, EF)));
                } else {
                    // Super binding
                    binds.push_back(bind(pair.first, pair.second));
                }
            }
            retval = make<Local>(ast->location, EF, binds, retval);
        }

        return retval;
    }